

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::CalcCoordMatrix
          (ChElementHexaANCF_3813_9 *this,ChMatrixNM<double,_11,_3> *d)

{
  Scalar SVar1;
  long lVar2;
  element_type *peVar3;
  Scalar *pSVar4;
  long lVar5;
  int i;
  long row;
  
  lVar5 = 0;
  for (row = 0; row != 8; row = row + 1) {
    lVar2 = *(long *)((long)&(((this->m_nodes).
                               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr + lVar5);
    SVar1 = *(Scalar *)(lVar2 + 0x20);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>,_1> *)d,row,0);
    *pSVar4 = SVar1;
    SVar1 = *(Scalar *)(lVar2 + 0x28);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>,_1> *)d,row,1);
    *pSVar4 = SVar1;
    SVar1 = *(Scalar *)(lVar2 + 0x30);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>,_1> *)d,row,2);
    lVar5 = lVar5 + 0x10;
    *pSVar4 = SVar1;
  }
  peVar3 = (this->m_central_node).
           super___shared_ptr<chrono::fea::ChNodeFEAcurv,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (d->super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>).m_storage.m_data.array[0x18] =
       *(double *)&(peVar3->super_ChNodeFEAbase).field_0x20;
  (d->super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>).m_storage.m_data.array[0x19] =
       *(double *)&peVar3->field_0x28;
  (d->super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>).m_storage.m_data.array[0x1a] =
       *(double *)&peVar3->field_0x30;
  (d->super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>).m_storage.m_data.array[0x1b] =
       (peVar3->m_ryy).m_data[0];
  (d->super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>).m_storage.m_data.array[0x1c] =
       (peVar3->m_ryy).m_data[1];
  (d->super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>).m_storage.m_data.array[0x1d] =
       (peVar3->m_ryy).m_data[2];
  (d->super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>).m_storage.m_data.array[0x1e] =
       (peVar3->m_rzz).m_data[0];
  (d->super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>).m_storage.m_data.array[0x1f] =
       (peVar3->m_rzz).m_data[1];
  (d->super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>).m_storage.m_data.array[0x20] =
       (peVar3->m_rzz).m_data[2];
  return;
}

Assistant:

void ChElementHexaANCF_3813_9::CalcCoordMatrix(ChMatrixNM<double, 11, 3>& d) {
    for (int i = 0; i < 8; i++) {
        const ChVector<>& pos = m_nodes[i]->GetPos();
        d(i, 0) = pos.x();
        d(i, 1) = pos.y();
        d(i, 2) = pos.z();
    }

    const ChVector<>& rxx = m_central_node->GetCurvatureXX();
    const ChVector<>& ryy = m_central_node->GetCurvatureYY();
    const ChVector<>& rzz = m_central_node->GetCurvatureZZ();

    d(8, 0) = rxx.x();
    d(8, 1) = rxx.y();
    d(8, 2) = rxx.z();

    d(9, 0) = ryy.x();
    d(9, 1) = ryy.y();
    d(9, 2) = ryy.z();

    d(10, 0) = rzz.x();
    d(10, 1) = rzz.y();
    d(10, 2) = rzz.z();
}